

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall RealCommandRunner::CanRunMore(RealCommandRunner *this)

{
  pointer ppSVar1;
  pointer ppSVar2;
  bool bVar3;
  size_type sVar4;
  double dVar5;
  
  ppSVar1 = (this->subprocs_).running_.
            super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppSVar2 = (this->subprocs_).running_.
            super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  sVar4 = std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>::size
                    (&(this->subprocs_).finished_.c);
  if ((int)sVar4 + (int)((ulong)((long)ppSVar1 - (long)ppSVar2) >> 3) < *(int *)(this->config_ + 8))
  {
    bVar3 = true;
    if (((this->subprocs_).running_.super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (this->subprocs_).running_.super__Vector_base<Subprocess_*,_std::allocator<Subprocess_*>_>.
         _M_impl.super__Vector_impl_data._M_finish) && (0.0 < *(double *)(this->config_ + 0x10))) {
      dVar5 = GetLoadAverage();
      bVar3 = dVar5 < *(double *)(this->config_ + 0x10);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool RealCommandRunner::CanRunMore() const {
  size_t subproc_number =
      subprocs_.running_.size() + subprocs_.finished_.size();
  return (int)subproc_number < config_.parallelism
    && ((subprocs_.running_.empty() || config_.max_load_average <= 0.0f)
        || GetLoadAverage() < config_.max_load_average);
}